

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cpp
# Opt level: O2

void __thiscall
trun::SubProcess::Start(SubProcess *this,Ref *library,Ref *useModule,string *ipcName)

{
  undefined8 uVar1;
  long *plVar2;
  thread local_68;
  long *local_60;
  SubProcess *local_58;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x58),
             &useModule->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(this + 0x68) = uVar1;
  *(undefined4 *)(*(long *)(this + 0x58) + 8) = 1;
  local_58 = this;
  std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_40,ipcName);
  local_68._M_id._M_thread = (id)0;
  plVar2 = (long *)operator_new(0x40);
  *plVar2 = (long)&PTR___State_impl_0023ccf0;
  plVar2[1] = (long)local_58;
  std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 2),&local_50);
  std::__cxx11::string::string((string *)(plVar2 + 4),&local_40);
  local_60 = plVar2;
  std::thread::_M_start_thread(&local_68,&local_60,0);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  std::thread::operator=((thread *)(this + 0x50),&local_68);
  std::thread::~thread(&local_68);
  Start(std::shared_ptr<trun::IDynLibrary>const&,std::shared_ptr<trun::TestModule>,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_58);
  return;
}

Assistant:

void SubProcess::Start(const IDynLibrary::Ref &library, TestModule::Ref useModule, const std::string &ipcName) {
    // Save this locally, we need to update the state
    module = std::move(useModule);

    // Need to do this before spinning up the thread...
    tStart = pclock::now();

    module->ChangeState(TestModule::kState::Executing);

    // Note: CAN'T USE REFERENCES - they will change before capture actually takes place..
    thread = std::thread([this, library, ipcName]() {
        state = SubProcessState::kRunning;

        //
        // TO-DO
        //  - Forward certain config settings (like; -G/-D/-r/-c/-C
        //
        std::string optionals = {};
        if (!Config::Instance().testGlobalMain) optionals += "G";
        if (!Config::Instance().linuxUseDeepBinding) optionals += "D";
        if (!Config::Instance().skipOnModuleFail) optionals += "c";
        if (!Config::Instance().stopOnAllFail) optionals += "C";

        proc = new Process(Config::Instance().appName);
        proc->SetCallback(&dataHandler);
        name = module->name;
        if(!optionals.empty()) {
            optionals = "-" + optionals;
            proc->AddArgument(optionals);
        }

        proc->AddArgument("--sequential");  // otherwise we would fork ourselves
        proc->AddArgument("--subprocess");  // hidden; telling trun it's running as a sub-process
        proc->AddArgument("--ipc-name");    // hidden; telling trun which IPC FIFO file name it should use
        proc->AddArgument(ipcName);
        proc->AddArgument("-m");            // Append the module
        proc->AddArgument(module->name);
        proc->AddArgument(library->Name());
        wasProcessExecOk = proc->ExecuteAndWait();
        state = SubProcessState::kFinished;
        exitStatus = proc->GetExitStatus();
    });

}